

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

void __thiscall OpenMD::Atom::Atom(Atom *this,AtomType *at)

{
  bool bVar1;
  AtomType *in_RSI;
  undefined8 *in_RDI;
  RealType RVar2;
  double dVar3;
  AtomType *unaff_retaddr;
  AtomType *in_stack_00000018;
  FluctuatingChargeAdapter fca;
  FluctuatingChargeAdapter *in_stack_00000030;
  undefined8 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  FluctuatingChargeAdapter local_28 [3];
  AtomType *local_10;
  
  local_10 = in_RSI;
  StuntDouble::StuntDouble
            ((StuntDouble *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             (ObjectType)((ulong)in_stack_ffffffffffffffb8 >> 0x20),0x235741);
  *in_RDI = &PTR__Atom_0034c290;
  in_RDI[0xf] = local_10;
  RVar2 = AtomType::getMass(in_stack_00000018);
  in_RDI[7] = RVar2;
  bVar1 = AtomType::isFluctuatingCharge(unaff_retaddr);
  if (bVar1) {
    FluctuatingChargeAdapter::FluctuatingChargeAdapter(local_28,local_10);
    RVar2 = FluctuatingChargeAdapter::getChargeMass(in_stack_00000030);
    in_RDI[0x10] = RVar2;
  }
  else {
    dVar3 = std::numeric_limits<double>::infinity();
    in_RDI[0x10] = dVar3;
  }
  return;
}

Assistant:

Atom::Atom(AtomType* at) :
      StuntDouble(otAtom, &Snapshot::atomData), atomType_(at) {
    mass_ = at->getMass();
    if (at->isFluctuatingCharge()) {
      FluctuatingChargeAdapter fca = FluctuatingChargeAdapter(at);
      chargeMass_                  = fca.getChargeMass();
    } else {
      chargeMass_ = std::numeric_limits<RealType>::infinity();
    }
  }